

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestOneStep2::RegisterBuildTestOneStep2(RegisterBuildTestOneStep2 *this)

{
  RegisterBuildTestOneStep2 *this_local;
  
  RegisterTest(BuildTestOneStep2::Create,"BuildTest.OneStep2");
  return;
}

Assistant:

TEST_F(BuildTest, OneStep2) {
  // Given a target with one dirty input,
  // we should rebuild the target.
  Dirty("cat1");
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat1", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cat in1 > cat1", command_runner_.commands_ran_[0]);
}